

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O3

void test_error_without_error_callback(void)

{
  cio_error cVar1;
  cio_inet_address *arg1;
  cio_http_server_configuration config;
  cio_http_server server;
  cio_http_server_configuration cStack_218;
  cio_http_server local_160;
  
  memcpy(&cStack_218,&DAT_001186c0,0xb8);
  arg1 = cio_get_inet_address_any4();
  cio_init_inet_socket_address(&cStack_218.endpoint,arg1,0x1f90);
  cVar1 = cio_http_server_init(&local_160,&loop,&cStack_218);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Server initialization failed!",0x794,UNITY_DISPLAY_STYLE_INT);
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  client_socket = alloc_dummy_client_no_buffer();
  split_request("GET /foo HTTP/1.1\r\n\r\n");
  cVar1 = cio_http_server_serve(&local_160);
  UnityAssertEqualNumber(0,(long)cVar1,"Serving http failed!",0x79c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)serve_error_fake.call_count,"Serve error callback was not called!",0x79e,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_error_without_error_callback(void)
{
	struct cio_http_server_configuration config = {
	    .on_error = NULL,
	    .read_header_timeout_ns = header_read_timeout,
	    .read_body_timeout_ns = body_read_timeout,
	    .response_timeout_ns = response_timeout,
	    .close_timeout_ns = 10,
	    .alloc_client = alloc_dummy_client_no_buffer,
	    .free_client = free_dummy_client};

	cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

	struct cio_http_server server;
	enum cio_error err = cio_http_server_init(&server, &loop, &config);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

	free_dummy_client(client_socket);
	client_socket = alloc_dummy_client_no_buffer();

	split_request("GET /foo HTTP/1.1" CRLF CRLF);

	err = cio_http_server_serve(&server);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

	TEST_ASSERT_EQUAL_MESSAGE(0, serve_error_fake.call_count, "Serve error callback was not called!");
}